

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnSimdShuffleOpExpr
          (BinaryReaderIR *this,Opcode opcode,v128 value)

{
  Result RVar1;
  unique_ptr<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>_> local_38;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  BinaryReaderIR *local_28;
  BinaryReaderIR *this_local;
  v128 value_local;
  Opcode opcode_local;
  
  value_local.v._0_8_ = value.v._8_8_;
  this_local = value.v._0_8_;
  local_28 = this;
  value_local.v._8_4_ = opcode.enum_;
  MakeUnique<wabt::SimdShuffleOpExpr,wabt::Opcode&,v128&>
            ((wabt *)&local_38,(Opcode *)(value_local.v + 8),(v128 *)&this_local);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::SimdShuffleOpExpr,std::default_delete<wabt::SimdShuffleOpExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_30,&local_38);
  value_local.v._12_4_ = AppendExpr(this,&local_30);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_30);
  std::unique_ptr<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>_>::
  ~unique_ptr(&local_38);
  RVar1.enum_._0_1_ = value_local.v[0xc];
  RVar1.enum_._1_1_ = value_local.v[0xd];
  RVar1.enum_._2_1_ = value_local.v[0xe];
  RVar1.enum_._3_1_ = value_local.v[0xf];
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSimdShuffleOpExpr(Opcode opcode, v128 value) {
  return AppendExpr(MakeUnique<SimdShuffleOpExpr>(opcode, value));
}